

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O0

lws_mqtt_str_t * lws_mqtt_str_create_init(uint8_t *buf,uint16_t len,uint16_t lim)

{
  lws_mqtt_str_t *s;
  uint16_t lim_local;
  uint16_t len_local;
  uint8_t *buf_local;
  
  s._4_2_ = lim;
  if (lim == 0) {
    s._4_2_ = len;
  }
  buf_local = (uint8_t *)lws_mqtt_str_create(s._4_2_);
  if ((lws_mqtt_str_t *)buf_local == (lws_mqtt_str_t *)0x0) {
    buf_local = (uint8_t *)0x0;
  }
  else {
    memcpy(((lws_mqtt_str_t *)buf_local)->buf,buf,(ulong)len);
    ((lws_mqtt_str_t *)buf_local)->len = len;
    ((lws_mqtt_str_t *)buf_local)->len_valid = '\x01';
    ((lws_mqtt_str_t *)buf_local)->pos = len;
  }
  return (lws_mqtt_str_t *)buf_local;
}

Assistant:

lws_mqtt_str_t *
lws_mqtt_str_create_init(uint8_t *buf, uint16_t len, uint16_t lim)
{
	lws_mqtt_str_t *s;

	if (!lim)
		lim = len;

	s = lws_mqtt_str_create(lim);

	if (!s)
		return NULL;

	memcpy(s->buf, buf, len);
	s->len = len;
	s->len_valid = 1;
	s->pos = len;

	return s;
}